

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeDeviceGetVectorWidthPropertiesExt
          (ze_device_handle_t hDevice,uint32_t *pCount,
          ze_device_vector_width_properties_ext_t *pVectorWidthProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010d288 != (code *)0x0) {
    zVar1 = (*DAT_0010d288)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetVectorWidthPropertiesExt(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        uint32_t* pCount,                               ///< [in,out] pointer to the number of vector width properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of vector width properties available.
                                                        ///< if count is greater than the number of vector width properties
                                                        ///< available, then the driver shall update the value with the correct
                                                        ///< number of vector width properties available.
        ze_device_vector_width_properties_ext_t* pVectorWidthProperties ///< [in,out][optional][range(0, *pCount)] array of vector width properties.
                                                        ///< if count is less than the number of properties available, then the
                                                        ///< driver will return only the number requested.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVectorWidthPropertiesExt = context.zeDdiTable.Device.pfnGetVectorWidthPropertiesExt;
        if( nullptr != pfnGetVectorWidthPropertiesExt )
        {
            result = pfnGetVectorWidthPropertiesExt( hDevice, pCount, pVectorWidthProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }